

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

double __thiscall SpeciesReaction::CalculatePropensity(SpeciesReaction *this)

{
  double dVar1;
  pointer pbVar2;
  int iVar3;
  SpeciesTracker *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *reactant;
  pointer reactant_00;
  double dVar4;
  
  if ((this->super_Reaction).remove_ == true) {
    (this->super_Reaction).old_prop_ = 0.0;
  }
  dVar4 = this->rate_constant_;
  pbVar2 = (this->reactants_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (reactant_00 = (this->reactants_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; reactant_00 != pbVar2;
      reactant_00 = reactant_00 + 1) {
    this_00 = SpeciesTracker::Instance();
    iVar3 = SpeciesTracker::species(this_00,reactant_00);
    dVar4 = dVar4 * (double)iVar3;
  }
  dVar1 = (this->super_Reaction).old_prop_;
  (this->super_Reaction).old_prop_ = dVar4;
  return dVar4 - dVar1;
}

Assistant:

double SpeciesReaction::CalculatePropensity() {
  if (remove_ == true) {
    old_prop_ = 0;
  }
  double new_prop = rate_constant_;
  for (const auto &reactant : reactants_) {
    new_prop *= SpeciesTracker::Instance().species(reactant);
  }
  double prop_diff = new_prop - old_prop_;
  old_prop_ = new_prop;
  return prop_diff;
}